

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructuresOperators.cpp
# Opt level: O0

ostream * operator<<(ostream *outs,Triangle *triangle)

{
  ostream *poVar1;
  Triangle *triangle_local;
  ostream *outs_local;
  
  poVar1 = std::operator<<(outs,"x: ");
  poVar1 = operator<<(poVar1,&triangle->x);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = operator<<(poVar1,triangle->colorX);
  poVar1 = std::operator<<(poVar1,") y: ");
  poVar1 = operator<<(poVar1,&triangle->y);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = operator<<(poVar1,triangle->colorY);
  poVar1 = std::operator<<(poVar1,") z: ");
  poVar1 = operator<<(poVar1,&triangle->z);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = operator<<(poVar1,triangle->colorZ);
  std::operator<<(poVar1,")");
  return outs;
}

Assistant:

std::ostream& operator<<(std::ostream& outs, Triangle const& triangle)
{
  outs << "x: " << triangle.x << " (" << triangle.colorX << ") y: " << triangle.y << " ("
       << triangle.colorY << ") z: " << triangle.z << " (" << triangle.colorZ << ")";
  return outs;
}